

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O1

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,void *p)

{
  char **ppcVar1;
  char cVar2;
  char *pcVar3;
  uintptr_t i;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  ppcVar1 = &(this->m_buffer).m_cur;
  pcVar3 = (this->m_buffer).m_cur;
  if (0x20 < (int)ppcVar1 - (int)pcVar3) {
    pcVar3[0] = '0';
    pcVar3[1] = 'x';
    uVar5 = 1;
    pcVar7 = pcVar3 + 1;
    do {
      pcVar6 = pcVar7;
      uVar4 = uVar5;
      pcVar6[1] = "0123456789ABCDEF"[(uint)p & 0xf];
      pcVar7 = pcVar6 + 1;
      uVar5 = uVar4 + 1;
      bVar8 = (void *)0xf < p;
      p = (void *)((ulong)p >> 4);
    } while (bVar8);
    pcVar6[2] = '\0';
    if (2 < uVar5) {
      pcVar3 = pcVar3 + 3;
      do {
        cVar2 = pcVar3[-1];
        pcVar3[-1] = *pcVar7;
        *pcVar7 = cVar2;
        pcVar7 = pcVar7 + -1;
        bVar8 = pcVar3 < pcVar7;
        pcVar3 = pcVar3 + 1;
      } while (bVar8);
    }
    *ppcVar1 = *ppcVar1 + uVar4;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(const void* p)
{
	// convert to number
	uintptr_t i = reinterpret_cast<uintptr_t>(p);
	if (m_buffer.avail() > kMaxNumericSize)
	{
		char * buf = m_buffer.current();
		buf[0] = '0';
		buf[1] = 'x';
		size_t len = detail::convertHex(buf + 2, i);
		m_buffer.add(len);
	}
	return *this;
}